

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

size_t ilog2(size_t i)

{
  size_t result;
  size_t i_local;
  
  result = 0;
  i_local = i;
  if (0xffff < i) {
    result = 0x10;
    i_local = i >> 0x10;
  }
  if (0xff < i_local) {
    result = result + 8;
    i_local = i_local >> 8;
  }
  if (0xf < i_local) {
    result = result + 4;
    i_local = i_local >> 4;
  }
  if (3 < i_local) {
    result = result + 2;
    i_local = i_local >> 2;
  }
  if (1 < i_local) {
    result = result + 1;
  }
  return result;
}

Assistant:

static size_t ilog2(size_t i) {
  size_t result = 0;
  if(i >= 65536) { result += 16; i >>= 16; }
  if(i >= 256) { result += 8; i >>= 8; }
  if(i >= 16) { result += 4; i >>= 4; }
  if(i >= 4) { result += 2; i >>= 2; }
  if(i >= 2) { result += 1; /*i >>= 1;*/ }
  return result;
}